

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtDec.c
# Opt level: O2

Dec_Edge_t Rwt_TravCollect_rec(Rwt_Man_t *p,Rwt_Node_t *pNode,Dec_Graph_t *pGraph)

{
  Dec_Edge_t DVar1;
  Dec_Edge_t DVar2;
  Dec_Edge_t DVar3;
  Dec_Node_t *pDVar4;
  
  if ((*(uint *)&pNode->field_0x8 >> 0x1e & 1) == 0) {
    if (pNode->TravId == p->nTravIds) {
      DVar1 = (Dec_Edge_t)(*(uint *)&pNode->field_0x8 >> 0x10 & 0xff);
    }
    else {
      pNode->TravId = p->nTravIds;
      DVar1 = Rwt_TravCollect_rec(p,(Rwt_Node_t *)((ulong)pNode->p0 & 0xfffffffffffffffe),pGraph);
      DVar1 = (Dec_Edge_t)(*(uint *)&pNode->p0 & 1 ^ (uint)DVar1);
      DVar2 = Rwt_TravCollect_rec(p,(Rwt_Node_t *)((ulong)pNode->p1 & 0xfffffffffffffffe),pGraph);
      DVar2 = (Dec_Edge_t)(*(uint *)&pNode->p1 & 1 ^ (uint)DVar2);
      if (*(int *)&pNode->field_0x8 < 0) {
        DVar3 = Dec_GraphAddNodeAnd(pGraph,(Dec_Edge_t)((uint)DVar1 ^ 1),DVar2);
        DVar1 = Dec_GraphAddNodeAnd(pGraph,DVar1,(Dec_Edge_t)((uint)DVar2 ^ 1));
        pDVar4 = Dec_GraphAppendNode(pGraph);
        *(uint *)&pDVar4->field_0x10 =
             (*(uint *)&pDVar4->field_0x10 & 0xfffe3fff) +
             (((uint)DVar1 & 1) << 0x10 | ((uint)DVar3 & 1) << 0xf) + 0x4000;
        pDVar4->eEdge0 = (Dec_Edge_t)((uint)DVar3 ^ 1);
        pDVar4->eEdge1 = (Dec_Edge_t)((uint)DVar1 ^ 1);
        DVar1 = (Dec_Edge_t)((pGraph->nSize * 2 + 0x7ffffffeU & 0x7ffffffe) + 1);
      }
      else {
        DVar1 = Dec_GraphAddNodeAnd(pGraph,DVar1,DVar2);
      }
      pNode->field_0xa = DVar1._0_1_;
    }
  }
  else {
    DVar1 = (Dec_Edge_t)(pNode->Id * 2 + 0x7ffffffeU & 0x7ffffffe);
  }
  return DVar1;
}

Assistant:

Dec_Edge_t Rwt_TravCollect_rec( Rwt_Man_t * p, Rwt_Node_t * pNode, Dec_Graph_t * pGraph )
{
    Dec_Edge_t eNode0, eNode1, eNode;
    // elementary variable
    if ( pNode->fUsed )
        return Dec_EdgeCreate( pNode->Id - 1, 0 );
    // previously visited node
    if ( pNode->TravId == p->nTravIds )
        return Dec_IntToEdge( pNode->Volume );
    pNode->TravId = p->nTravIds;
    // solve for children
    eNode0 = Rwt_TravCollect_rec( p, Rwt_Regular(pNode->p0), pGraph );
    if ( Rwt_IsComplement(pNode->p0) )    
        eNode0.fCompl = !eNode0.fCompl;
    eNode1 = Rwt_TravCollect_rec( p, Rwt_Regular(pNode->p1), pGraph );
    if ( Rwt_IsComplement(pNode->p1) )    
        eNode1.fCompl = !eNode1.fCompl;
    // create the decomposition node(s)
    if ( pNode->fExor )
        eNode = Dec_GraphAddNodeXor( pGraph, eNode0, eNode1, 0 );
    else
        eNode = Dec_GraphAddNodeAnd( pGraph, eNode0, eNode1 );
    // save the result
    pNode->Volume = Dec_EdgeToInt( eNode );
    return eNode;
}